

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmepoll.c
# Opt level: O0

void libcmepoll_LTX_remove_select(CMtrans_services_conflict svc,select_data_ptr *sdp,int fd)

{
  int iVar1;
  uint *puVar2;
  int in_EDX;
  long *in_RSI;
  epoll_event ep_event;
  select_data_ptr sd;
  CManager in_stack_ffffffffffffffc0;
  FILE *pFVar3;
  select_data_ptr *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  uint32_t in_stack_ffffffffffffffd4;
  long local_20;
  
  local_20 = *in_RSI;
  memset(&stack0xffffffffffffffd4,0,0xc);
  if (local_20 == 0) {
    init_select_data((CMtrans_services_conflict)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    local_20 = *in_RSI;
  }
  *(int *)(local_20 + 0x38) = *(int *)(local_20 + 0x38) + 1;
  if (*(long *)(*(long *)(local_20 + 0x18) + (long)in_EDX * 0x18) == 0) {
    iVar1 = epoll_ctl(*(int *)(local_20 + 8),2,in_EDX,(epoll_event *)&stack0xffffffffffffffd4);
    if (iVar1 < 0) {
      pFVar3 = _stderr;
      puVar2 = (uint *)__errno_location();
      fprintf(pFVar3,"Something bad happened in %s. %d\n","libcmepoll_LTX_remove_select",
              (ulong)*puVar2);
    }
  }
  else {
    iVar1 = epoll_ctl(*(int *)(local_20 + 8),3,in_EDX,(epoll_event *)&stack0xffffffffffffffd4);
    if (iVar1 < 0) {
      pFVar3 = _stderr;
      puVar2 = (uint *)__errno_location();
      fprintf(pFVar3,"Something bad happened in %s. %d\n","libcmepoll_LTX_remove_select",
              (ulong)*puVar2);
    }
  }
  *(undefined8 *)(*(long *)(local_20 + 0x10) + (long)in_EDX * 0x18) = 0;
  *(undefined8 *)(*(long *)(local_20 + 0x10) + (long)in_EDX * 0x18 + 8) = 0;
  *(undefined8 *)(*(long *)(local_20 + 0x10) + (long)in_EDX * 0x18 + 0x10) = 0;
  wake_server_thread((select_data_ptr)0x102285);
  return;
}

Assistant:

extern void
libcmepoll_LTX_remove_select(CMtrans_services svc, select_data_ptr *sdp, int fd)
{
    select_data_ptr sd = *((select_data_ptr *)sdp);

    struct epoll_event ep_event = {0}; // for a dumb kernel bug that we will never see

    if (sd == NULL) {
	init_select_data(svc, (select_data_ptr*)sdp, (CManager)NULL);
	sd = *((select_data_ptr *)sdp);
    }
    sd->select_consistency_number++;
    if(sd->write_items[fd].func) {
    	/* this fd should stay armed for write */
    	ep_event.data.fd = fd;
    	ep_event.events = EPOLLOUT;
    	if (epoll_ctl(sd->epfd, EPOLL_CTL_MOD, fd, &ep_event) < 0) {
    	    fprintf(stderr, "Something bad happened in %s. %d\n", __func__, errno);
    	}
    } else {
    	if(epoll_ctl(sd->epfd, EPOLL_CTL_DEL, fd, &ep_event) < 0) {
    		fprintf(stderr, "Something bad happened in %s. %d\n", __func__, errno);
        }
    }

    sd->select_items[fd].func = NULL;
    sd->select_items[fd].arg1 = NULL;
    sd->select_items[fd].arg2 = NULL;
    wake_server_thread(sd);
}